

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O2

int __thiscall TreeNode::pathIndex(TreeNode *this,QString *filepath)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_40,"\\");
  iVar1 = QString::indexOf((QString *)filepath,(longlong)&local_40,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QString::QString((QString *)&local_40,"/");
  iVar2 = QString::indexOf((QString *)filepath,(longlong)&local_40,CaseInsensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  if (iVar2 == -1) {
    iVar3 = iVar1;
  }
  if (iVar1 == -1) {
    iVar3 = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int pathIndex(const QString &filepath) {
        int Windex = filepath.indexOf("\\");
        int Uindex = filepath.indexOf("/");
        if (Windex != -1 && Uindex != -1)
            return qMin(Windex, Uindex);
        else if (Windex != -1)
            return Windex;
        return Uindex;
    }